

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this)

{
  Rep *pRVar1;
  int iVar2;
  
  if (this->tagged_rep_or_elem_ != (void *)0x0) {
    if (this->arena_ == (Arena *)0x0) {
      iVar2 = 1;
      if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
        pRVar1 = rep(this);
        iVar2 = pRVar1->allocated_size;
      }
      if (this->capacity_proxy_ + 1 < iVar2) goto LAB_0094f349;
      Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>();
    }
    return;
  }
  Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            ((RepeatedPtrFieldBase *)&stack0xffffffffffffffe8);
LAB_0094f349:
  Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>();
}

Assistant:

inline bool NeedsDestroy() const {
    // Either there is an allocated element in SSO buffer or there is an
    // allocated Rep.
    return tagged_rep_or_elem_ != nullptr;
  }